

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O1

vector<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_> *
BitSetsFromSets<256ul>
          (vector<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_> *__return_storage_ptr__,
          vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *names)

{
  _WordT *p_Var1;
  pointer puVar2;
  iterator __position;
  pointer pbVar3;
  const_iterator cVar4;
  undefined8 uVar5;
  pointer puVar6;
  _Hash_node_base *p_Var7;
  bitset<256UL> x;
  bitset<256UL> local_58;
  
  local_58.super__Base_bitset<4UL>._M_w = (_Base_bitset<4UL>)ZEXT1632(ZEXT816(0));
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT416(0) << 0x40,0);
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT416(0) << 0x40,8);
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>::reserve
            (__return_storage_ptr__,
             ((long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(sets->
                    super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  puVar6 = (sets->
           super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (sets->
           super__Vector_base<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar2) {
      return __return_storage_ptr__;
    }
    local_58.super__Base_bitset<4UL>._M_w = (_Base_bitset<4UL>)ZEXT1632(ZEXT816(0) << 0x40);
    for (p_Var7 = (puVar6->_M_h)._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
        p_Var7 = p_Var7->_M_nxt) {
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&names->_M_h,(key_type *)(p_Var7 + 1));
      if (cVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar5 = std::__throw_out_of_range("_Map_base::at");
        pbVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (pbVar3 != (pointer)0x0) {
          operator_delete(pbVar3);
        }
        _Unwind_Resume(uVar5);
      }
      p_Var1 = local_58.super__Base_bitset<4UL>._M_w +
               (*(ulong *)((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28) >> 6);
      *p_Var1 = *p_Var1 | 1L << (*(ulong *)((long)cVar4.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28) & 0x3f);
    }
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::bitset<256ul>,std::allocator<std::bitset<256ul>>>::
      _M_realloc_insert<std::bitset<256ul>&>
                ((vector<std::bitset<256ul>,std::allocator<std::bitset<256ul>>> *)
                 __return_storage_ptr__,__position,&local_58);
    }
    else {
      ((__position._M_current)->super__Base_bitset<4UL>)._M_w[0] =
           local_58.super__Base_bitset<4UL>._M_w[0];
      ((__position._M_current)->super__Base_bitset<4UL>)._M_w[1] =
           local_58.super__Base_bitset<4UL>._M_w[1];
      ((__position._M_current)->super__Base_bitset<4UL>)._M_w[2] =
           local_58.super__Base_bitset<4UL>._M_w[2];
      ((__position._M_current)->super__Base_bitset<4UL>)._M_w[3] =
           local_58.super__Base_bitset<4UL>._M_w[3];
      (__return_storage_ptr__->
      super__Vector_base<std::bitset<256UL>,_std::allocator<std::bitset<256UL>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

std::vector<std::bitset<n_entities>> BitSetsFromSets(
        const std::vector<Set>& sets,
        const std::unordered_map<std::string, size_t>& names)
{
    std::bitset<n_entities> x;
    std::vector<std::bitset<n_entities>> binary_sets;
    binary_sets.reserve(sets.size());
    for (const auto& set : sets)
    {
        x.reset();
        for (const auto& elem : set)
            x[names.at(elem)] = true;
        binary_sets.emplace_back(x);
    }
    return binary_sets;
}